

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

_Bool override_component(ecs_world_t *world,ecs_entity_t component,ecs_type_t type,ecs_data_t *data,
                        ecs_column_t *column,int32_t row,int32_t count)

{
  ecs_copy_t p_Var1;
  void *pvVar2;
  byte bVar3;
  ecs_table_t *peVar4;
  _Bool _Var5;
  int32_t iVar6;
  int elem_size;
  void *pvVar7;
  void *__src;
  ecs_entity_t component_00;
  ecs_c_info_t *peVar8;
  void *pvVar9;
  size_t sVar10;
  int16_t offset;
  long lVar11;
  ulong uVar12;
  size_t __n;
  ulong local_58;
  ecs_entity_info_t local_50;
  
  pvVar7 = _ecs_vector_first(type,8,0x10);
  iVar6 = ecs_vector_count(type);
  lVar11 = (long)iVar6 + 1;
  do {
    uVar12 = *(ulong *)((long)pvVar7 + lVar11 * 8 + -0x10);
    bVar3 = (byte)(uVar12 >> 0x38);
    if (bVar3 < 0xfd) {
      return false;
    }
    if (bVar3 == 0xfe) {
      uVar12 = uVar12 & 0xffffffffffffff;
      local_58 = uVar12;
      _ecs_assert(component != 0,0xc,(char *)0x0,"component != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x269);
      if (component == 0) {
        __assert_fail("component != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x269,
                      "_Bool override_from_base(ecs_world_t *, ecs_entity_t, ecs_entity_t, ecs_data_t *, ecs_column_t *, int32_t, int32_t)"
                     );
      }
      _Var5 = ecs_get_info(world,uVar12,&local_50);
      peVar4 = local_50.table;
      if (_Var5 && local_50.table != (ecs_table_t *)0x0) {
        __src = get_component(&local_50,component);
        if (__src != (void *)0x0) {
          elem_size = (int)column->size;
          __n = (size_t)elem_size;
          offset = 0x10;
          if (0x10 < column->alignment) {
            offset = column->alignment;
          }
          pvVar7 = _ecs_vector_first(column->data,elem_size,offset);
          pvVar7 = (void *)((long)(elem_size * row) + (long)pvVar7);
          component_00 = ecs_get_typeid(world,component);
          peVar8 = ecs_get_c_info(world,component_00);
          if ((peVar8 == (ecs_c_info_t *)0x0) ||
             (p_Var1 = (peVar8->lifecycle).copy, p_Var1 == (ecs_copy_t)0x0)) {
            if (0 < count) {
              do {
                memcpy(pvVar7,__src,__n);
                pvVar7 = (void *)((long)pvVar7 + __n);
                count = count + -1;
              } while (count != 0);
            }
          }
          else {
            pvVar9 = _ecs_vector_first(data->entities,8,0x10);
            if (0 < count) {
              pvVar2 = (peVar8->lifecycle).ctx;
              do {
                sVar10 = ecs_to_size_t(__n);
                (*p_Var1)(world,component_00,(ecs_entity_t *)((long)pvVar9 + (long)row * 8),
                          &local_58,pvVar7,__src,sVar10,1,pvVar2);
                pvVar7 = (void *)((long)pvVar7 + __n);
                count = count + -1;
              } while (count != 0);
            }
          }
          return true;
        }
        _Var5 = override_component(world,component,peVar4->type,data,column,row,count);
        if (_Var5) {
          return true;
        }
      }
    }
    lVar11 = lVar11 + -1;
    if (lVar11 < 2) {
      return false;
    }
  } while( true );
}

Assistant:

static
bool override_component(
    ecs_world_t * world,
    ecs_entity_t component,
    ecs_type_t type,
    ecs_data_t * data,
    ecs_column_t * column,
    int32_t row,
    int32_t count)
{
    ecs_entity_t *type_array = ecs_vector_first(type, ecs_entity_t);
    int32_t i, type_count = ecs_vector_count(type);

    /* Walk prefabs */
    i = type_count - 1;
    do {
        ecs_entity_t e = type_array[i];

        if (e < ECS_TYPE_ROLE_START) {
            break;
        }

        if (ECS_HAS_ROLE(e, INSTANCEOF)) {
            if (override_from_base(world, e & ECS_COMPONENT_MASK, component, 
                data, column, row, count))
            {
                return true;
            }
        }
    } while (--i >= 0);

    return false;
}